

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_char(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos30;
  int yypos30;
  int yythunkpos28;
  int yypos28;
  int yythunkpos24;
  int yypos24;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yymatchChar(G,0x5c);
  if ((iVar4 == 0) || (iVar4 = yymatchClass(G,(uchar *)"","abefnrtv\'\"\\[\\]\\\\"), iVar4 == 0)) {
    G->pos = iVar5;
    G->thunkpos = iVar3;
    iVar4 = yymatchChar(G,0x5c);
    if ((iVar4 == 0) ||
       (((iVar4 = yymatchClass(G,(uchar *)"","0-3"), iVar4 == 0 ||
         (iVar4 = yymatchClass(G,(uchar *)"","0-7"), iVar4 == 0)) ||
        (iVar4 = yymatchClass(G,(uchar *)"","0-7"), iVar4 == 0)))) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
      iVar4 = yymatchChar(G,0x5c);
      if ((iVar4 == 0) || (iVar4 = yymatchClass(G,(uchar *)"","0-7"), iVar4 == 0)) {
        G->pos = iVar5;
        G->thunkpos = iVar3;
        iVar5 = G->pos;
        iVar3 = G->thunkpos;
        iVar4 = yymatchChar(G,0x5c);
        if (iVar4 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar3;
          iVar5 = yymatchDot(G);
          if (iVar5 != 0) {
            return 1;
          }
        }
        G->pos = iVar1;
        G->thunkpos = iVar2;
        return 0;
      }
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"","0-7");
      if (iVar5 == 0) {
        G->pos = iVar1;
        G->thunkpos = iVar2;
      }
    }
  }
  return 1;
}

Assistant:

YY_RULE(int) yy_char(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "char"));

  {  int yypos24= G->pos, yythunkpos24= G->thunkpos;  if (!yymatchChar(G, '\\')) goto l25;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\204\000\000\000\000\000\000\070\146\100\124\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "abefnrtv'\"\\[\\]\\\\")) goto l25;
  goto l24;
  l25:;	  G->pos= yypos24; G->thunkpos= yythunkpos24;  if (!yymatchChar(G, '\\')) goto l26;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\017\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-3")) goto l26;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l26;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l26;
  goto l24;
  l26:;	  G->pos= yypos24; G->thunkpos= yythunkpos24;  if (!yymatchChar(G, '\\')) goto l27;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l27;

  {  int yypos28= G->pos, yythunkpos28= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l28;
  goto l29;
  l28:;	  G->pos= yypos28; G->thunkpos= yythunkpos28;
  }
  l29:;	  goto l24;
  l27:;	  G->pos= yypos24; G->thunkpos= yythunkpos24;
  {  int yypos30= G->pos, yythunkpos30= G->thunkpos;  if (!yymatchChar(G, '\\')) goto l30;
  goto l23;
  l30:;	  G->pos= yypos30; G->thunkpos= yythunkpos30;
  }  if (!yymatchDot(G)) goto l23;
  }
  l24:;	  yyprintf((stderr, "  ok   char"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l23:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "char"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}